

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * aux_upvalue(StkId fi,int n,TValue **val,CClosure **owner,UpVal **uv)

{
  CClosure *pCVar1;
  lua_CFunction p_Var2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar4 = fi->tt_ & 0x3f;
  if (uVar4 == 6) {
    if (0 < n) {
      p_Var2 = (fi->value_).f;
      lVar3 = *(long *)(p_Var2 + 0x18);
      if (n <= *(int *)(lVar3 + 0x10)) {
        uVar5 = (ulong)(n - 1);
        *val = (TValue *)**(undefined8 **)(p_Var2 + uVar5 * 8 + 0x20);
        if (uv != (UpVal **)0x0) {
          *uv = *(UpVal **)(p_Var2 + uVar5 * 8 + 0x20);
        }
        lVar3 = *(long *)(*(long *)(lVar3 + 0x58) + uVar5 * 0x10);
        if (lVar3 == 0) {
          return "(*no name)";
        }
        return (char *)(lVar3 + 0x18);
      }
    }
  }
  else if (((uVar4 == 0x26) && (0 < n)) &&
          (pCVar1 = (CClosure *)(fi->value_).f, n <= (int)(uint)pCVar1->nupvalues)) {
    *val = pCVar1->upvalue + (n - 1);
    if (owner == (CClosure **)0x0) {
      return "";
    }
    *owner = pCVar1;
    return "";
  }
  return (char *)0x0;
}

Assistant:

static const char *aux_upvalue(StkId fi, int n, TValue **val,
                               CClosure **owner, UpVal **uv) {
    switch (ttype(fi)) {
        case LUA_TCCL: {  /* C closure */
            CClosure *f = clCvalue(fi);
            if (!(1 <= n && n <= f->nupvalues)) return NULL;
            *val = &f->upvalue[n - 1];
            if (owner) *owner = f;
            return "";
        }
        case LUA_TLCL: {  /* Lua closure */
            LClosure *f = clLvalue(fi);
            TString *name;
            Proto *p = f->p;
            if (!(1 <= n && n <= p->sizeupvalues)) return NULL;
            *val = f->upvals[n - 1]->v;
            if (uv) *uv = f->upvals[n - 1];
            name = p->upvalues[n - 1].name;
            return (name == NULL) ? "(*no name)" : getstr(name);
        }
        default:
            return NULL;  /* not a closure */
    }
}